

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testFromChar(String *str)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  
  if ((str->view_)._M_len == 1) {
    if (*(str->view_)._M_str == 'a') {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
      iVar3 = 0xd0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strncmp(str.data(), \"a\", 1) == 0) failed on line ",0x42);
      iVar3 = 0xcf;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 1) failed on line ",0x2c);
    iVar3 = 0xce;
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return false;
}

Assistant:

static bool testFromChar(cm::String const& str)
{
  ASSERT_TRUE(str.size() == 1);
  ASSERT_TRUE(std::strncmp(str.data(), "a", 1) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}